

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSpeedup.c
# Opt level: O2

float Gia_ObjComputeArrival(Gia_Man_t *p,int iObj,int fUseSorting)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pObj;
  int *piVar4;
  uint uVar5;
  long lVar6;
  float *pfVar7;
  float fVar8;
  float local_134;
  int pPinPerm [32];
  float pPinDelays [32];
  
  pvVar1 = p->pLutLib;
  pObj = Gia_ManObj(p,iObj);
  uVar5 = (uint)*(undefined8 *)pObj;
  if ((~uVar5 & 0x9fffffff) != 0) {
    if ((~uVar5 & 0x1fffffff) == 0 || -1 < (int)uVar5) {
      iVar2 = Gia_ObjIsLut(p,iObj);
      if (iVar2 == 0) {
        __assert_fail("Gia_ObjIsLut(p, iObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSpeedup.c"
                      ,0x79,"float Gia_ObjComputeArrival(Gia_Man_t *, int, int)");
      }
      if (pvVar1 == (void *)0x0) {
        local_134 = -1e+09;
        for (lVar6 = 0; iVar2 = Gia_ObjLutSize(p,iObj), lVar6 < iVar2; lVar6 = lVar6 + 1) {
          piVar4 = Gia_ObjLutFanins(p,iObj);
          iVar2 = piVar4[lVar6];
          fVar8 = Gia_ObjTimeArrival(p,iVar2);
          if (local_134 < fVar8 + 1.0) {
            local_134 = Gia_ObjTimeArrival(p,iVar2);
            local_134 = local_134 + 1.0;
          }
        }
      }
      else {
        iVar2 = *(int *)((long)pvVar1 + 0xc);
        iVar3 = Gia_ObjLutSize(p,iObj);
        pfVar7 = (float *)((long)pvVar1 + (long)iVar3 * 0x84 + 0x94);
        if (iVar2 == 0) {
          local_134 = -1e+09;
          for (lVar6 = 0; iVar2 = Gia_ObjLutSize(p,iObj), lVar6 < iVar2; lVar6 = lVar6 + 1) {
            piVar4 = Gia_ObjLutFanins(p,iObj);
            iVar2 = piVar4[lVar6];
            fVar8 = Gia_ObjTimeArrival(p,iVar2);
            if (local_134 < fVar8 + *pfVar7) {
              local_134 = Gia_ObjTimeArrival(p,iVar2);
              local_134 = local_134 + *pfVar7;
            }
          }
        }
        else if (fUseSorting == 0) {
          local_134 = -1e+09;
          for (lVar6 = 0; iVar2 = Gia_ObjLutSize(p,iObj), lVar6 < iVar2; lVar6 = lVar6 + 1) {
            piVar4 = Gia_ObjLutFanins(p,iObj);
            iVar2 = piVar4[lVar6];
            fVar8 = Gia_ObjTimeArrival(p,iVar2);
            if (local_134 < fVar8 + pfVar7[lVar6]) {
              local_134 = Gia_ObjTimeArrival(p,iVar2);
              local_134 = local_134 + pfVar7[lVar6];
            }
          }
        }
        else {
          Gia_LutDelayTraceSortPins(p,iObj,pPinPerm,pPinDelays);
          local_134 = -1e+09;
          for (lVar6 = 0; iVar2 = Gia_ObjLutSize(p,iObj), lVar6 < iVar2; lVar6 = lVar6 + 1) {
            Gia_ObjLutFanins(p,iObj);
            iVar2 = pPinPerm[lVar6];
            iVar3 = Gia_ObjLutFanin(p,iObj,iVar2);
            fVar8 = Gia_ObjTimeArrival(p,iVar3);
            if (local_134 < fVar8 + pfVar7[lVar6]) {
              iVar2 = Gia_ObjLutFanin(p,iObj,iVar2);
              local_134 = Gia_ObjTimeArrival(p,iVar2);
              local_134 = local_134 + pfVar7[lVar6];
            }
          }
        }
      }
      iVar2 = Gia_ObjLutSize(p,iObj);
      fVar8 = 0.0;
      if (iVar2 != 0) {
        fVar8 = local_134;
      }
      return fVar8;
    }
    iObj = Gia_ObjFaninId0p(p,pObj);
  }
  fVar8 = Gia_ObjTimeArrival(p,iObj);
  return fVar8;
}

Assistant:

float Gia_ObjComputeArrival( Gia_Man_t * p, int iObj, int fUseSorting )
{
    If_LibLut_t * pLutLib = (If_LibLut_t *)p->pLutLib;
    Gia_Obj_t * pObj = Gia_ManObj( p, iObj );
    int k, iFanin, pPinPerm[32];
    float pPinDelays[32];
    float tArrival, * pDelays;
    if ( Gia_ObjIsCi(pObj) )
        return Gia_ObjTimeArrival(p, iObj);
    if ( Gia_ObjIsCo(pObj) )
        return Gia_ObjTimeArrival(p, Gia_ObjFaninId0p(p, pObj) );
    assert( Gia_ObjIsLut(p, iObj) );
    tArrival = -TIM_ETERNITY;
    if ( pLutLib == NULL )
    {
        Gia_LutForEachFanin( p, iObj, iFanin, k )
            if ( tArrival < Gia_ObjTimeArrival(p, iFanin) + 1.0 )
                tArrival = Gia_ObjTimeArrival(p, iFanin) + 1.0;
    }
    else if ( !pLutLib->fVarPinDelays )
    {
        pDelays = pLutLib->pLutDelays[Gia_ObjLutSize(p, iObj)];
        Gia_LutForEachFanin( p, iObj, iFanin, k )
            if ( tArrival < Gia_ObjTimeArrival(p, iFanin) + pDelays[0] )
                tArrival = Gia_ObjTimeArrival(p, iFanin) + pDelays[0];
    }
    else
    {
        pDelays = pLutLib->pLutDelays[Gia_ObjLutSize(p, iObj)];
        if ( fUseSorting )
        {
            Gia_LutDelayTraceSortPins( p, iObj, pPinPerm, pPinDelays );
            Gia_LutForEachFanin( p, iObj, iFanin, k ) 
                if ( tArrival < Gia_ObjTimeArrival( p, Gia_ObjLutFanin(p,iObj,pPinPerm[k])) + pDelays[k] )
                    tArrival = Gia_ObjTimeArrival( p, Gia_ObjLutFanin(p,iObj,pPinPerm[k])) + pDelays[k];
        }
        else
        {
            Gia_LutForEachFanin( p, iObj, iFanin, k )
                if ( tArrival < Gia_ObjTimeArrival(p, iFanin) + pDelays[k] )
                    tArrival = Gia_ObjTimeArrival(p, iFanin) + pDelays[k];
        }
    }
    if ( Gia_ObjLutSize(p, iObj) == 0 )
        tArrival = 0.0;
    return tArrival;
}